

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionInfo::AssertionInfo
          (AssertionInfo *this,string *_macroName,SourceLineInfo *_lineInfo,
          string *_capturedExpression,Flags _resultDisposition)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  Flags local_2c;
  string *psStack_28;
  Flags _resultDisposition_local;
  string *_capturedExpression_local;
  SourceLineInfo *_lineInfo_local;
  string *_macroName_local;
  AssertionInfo *this_local;
  
  local_2c = _resultDisposition;
  psStack_28 = _capturedExpression;
  _capturedExpression_local = &_lineInfo->file;
  _lineInfo_local = (SourceLineInfo *)_macroName;
  _macroName_local = &this->macroName;
  std::__cxx11::string::string((string *)this,(string *)_macroName);
  SourceLineInfo::SourceLineInfo(&this->lineInfo,(SourceLineInfo *)_capturedExpression_local);
  std::__cxx11::string::string((string *)&this->capturedExpression,(string *)psStack_28);
  this->resultDisposition = local_2c;
  bVar1 = shouldNegate(this->resultDisposition);
  if (bVar1) {
    std::operator+(&local_60,"!",psStack_28);
    std::__cxx11::string::operator=((string *)&this->capturedExpression,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

AssertionInfo::AssertionInfo(   const std::string& _macroName,
                                    const SourceLineInfo& _lineInfo,
                                    const std::string& _capturedExpression,
                                    ResultDisposition::Flags _resultDisposition )
    :   macroName( _macroName ),
        lineInfo( _lineInfo ),
        capturedExpression( _capturedExpression ),
        resultDisposition( _resultDisposition )
    {
        if( shouldNegate( resultDisposition ) )
            capturedExpression = "!" + _capturedExpression;
    }